

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.h
# Opt level: O2

int __thiscall
iqxmlrpc::Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
clone(Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
     ,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  
  this_00 = (Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  Scalar(this_00,&this->value_);
  return (int)this_00;
}

Assistant:

Scalar<T>* clone() const { return new Scalar<T>(value_); }